

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O1

Parsekey __thiscall
free_format_parser::HMpsFF::parseBounds(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  ulong *puVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char *pcVar7;
  pointer start;
  bool bVar8;
  Parsekey PVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  undefined8 uVar14;
  size_t start_00;
  iterator iVar15;
  ulong uVar16;
  ulong uVar17;
  undefined7 uVar18;
  byte bVar19;
  HighsInt id;
  HighsVarType HVar20;
  undefined1 this_00 [8];
  HMpsFF *pHVar21;
  ulong uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  bool skip;
  string marker;
  vector<bool,_std::allocator<bool>_> has_upper;
  string word_1;
  size_t end;
  vector<bool,_std::allocator<bool>_> has_lower;
  bool is_nan;
  string bound_type;
  size_t begin;
  string bound_name;
  string strline;
  string word;
  byte local_1ec;
  byte local_1e8;
  char local_1e4;
  Parsekey local_1d8;
  bool local_1d1;
  HMpsFF *local_1d0;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  undefined1 local_1a8 [16];
  ulong local_198;
  ulong local_190;
  key_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  undefined8 local_158;
  undefined4 local_150;
  undefined8 local_148;
  undefined1 local_140 [8];
  char *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  ulong local_120;
  _Alloc_hider local_118;
  pointer local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined8 local_f8;
  undefined4 local_f0;
  pointer local_e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_e0;
  string local_d8;
  double *local_b8 [2];
  double local_a8 [2];
  pointer local_98;
  string local_90;
  string local_70;
  pointer local_50;
  pointer local_48;
  undefined1 local_40 [16];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50 = (pointer)local_40;
  local_48 = (pointer)0x0;
  local_40[0] = 0;
  local_108._M_allocated_capacity = 0;
  local_108._8_4_ = 0;
  local_f8._0_4_ = ~kMaximize;
  local_f8._4_4_ = 0;
  local_f0 = 0;
  local_e8 = (pointer)0x0;
  local_168._M_allocated_capacity = 0;
  local_168._8_4_ = 0;
  local_158 = 0;
  local_150 = 0;
  local_148 = 0;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            ((vector<bool,_std::allocator<bool>_> *)&local_108,(long)this->num_col,false);
  this_00 = (undefined1  [8])&local_168;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            ((vector<bool,_std::allocator<bool>_> *)this_00,(long)this->num_col,false);
  local_e0 = &(this->colname2idx)._M_h;
  local_118._M_p = &DAT_00000001;
  local_1bc = 0;
  local_1c0 = 0;
  local_1c4 = 0;
  local_190 = 0;
  local_198 = 0;
  local_120 = 1;
  local_1b8 = 0;
  local_1b4 = 0;
  local_1b0 = 0;
  local_1ac = 0;
  local_1d0 = this;
  while( true ) {
    do {
      bVar8 = getMpsLine((HMpsFF *)this_00,file,&local_70,&local_1d1);
      pHVar21 = local_1d0;
      if (!bVar8) {
        local_1d8 = kFail;
        goto LAB_001fa907;
      }
    } while (local_1d1 != false);
    if ((0.0 < local_1d0->time_limit_) &&
       (lVar13 = std::chrono::_V2::system_clock::now(),
       dVar2 = (double)lVar13 / 1000000000.0 - pHVar21->start_time,
       pHVar21->time_limit_ <= dVar2 && dVar2 != pHVar21->time_limit_)) break;
    local_98 = (pointer)0x0;
    local_110 = (pointer)0x0;
    local_140 = (undefined1  [8])&local_130;
    local_138 = (char *)0x0;
    local_130._M_local_buf[0] = '\0';
    PVar9 = checkFirstWord(pHVar21,&local_70,(size_t *)&local_98,(size_t *)&local_110,
                           (string *)local_140);
    if (PVar9 == kNone) {
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,local_140,local_138 + (long)local_140);
      iVar10 = std::__cxx11::string::compare((char *)local_140);
      if (iVar10 == 0) {
        local_1e8 = 1;
        local_1ec = 0;
LAB_001fa075:
        auVar3._12_4_ = 0;
        auVar3._0_12_ = local_1a8._4_12_;
        local_1a8 = auVar3 << 0x20;
LAB_001fa07d:
        local_1e4 = '\0';
LAB_001fa085:
        bVar8 = false;
LAB_001fa088:
        start = local_110;
        first_word(&local_90,&local_70,(size_t)local_110);
        start_00 = first_word_end(&local_70,(size_t)start);
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        local_188._M_string_length = 0;
        local_188.field_2._M_local_buf[0] = '\0';
        iVar15 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(local_e0,&local_90);
        if (iVar15.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          first_word(&local_d8,&local_70,start_00);
          std::__cxx11::string::operator=((string *)&local_188,(string *)&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_d8._M_dataplus._M_p._1_7_,(char)local_d8._M_dataplus._M_p) !=
              &local_d8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_d8._M_dataplus._M_p._1_7_,(char)local_d8._M_dataplus._M_p
                                    ));
          }
          start_00 = first_word_end(&local_70,start_00);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_188);
        }
        iVar15 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(local_e0,&local_188);
        if (iVar15.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          uVar22 = 0xffffffff;
        }
        else {
          uVar22 = (ulong)*(uint *)((long)iVar15.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                          ._M_cur + 0x28);
        }
        if ((int)uVar22 < 0) {
          uVar11 = getColIdx(local_1d0,&local_188,true);
          uVar22 = (ulong)uVar11;
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_108,false);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_168,false);
        }
        iVar10 = (int)uVar22;
        if (local_1ec == 0) {
LAB_001fa1ef:
          if (local_1e8 != 0) {
            uVar16 = (ulong)iVar10;
            uVar17 = uVar16 + 0x3f;
            if (-1 < (long)uVar16) {
              uVar17 = uVar16;
            }
            if ((*(ulong *)(local_168._M_allocated_capacity +
                           (((long)uVar17 >> 6) +
                           ((ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8)
                 >> (uVar22 & 0x3f) & 1) != 0) goto LAB_001fa23c;
          }
          bVar19 = (byte)uVar22;
          if (bVar8) {
            if (local_1a8[0] == '\0') {
              uVar17 = (ulong)iVar10;
              uVar22 = uVar17 + 0x3f;
              if (-1 < (long)uVar17) {
                uVar22 = uVar17;
              }
              puVar1 = (local_1d0->col_binary).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       ((long)uVar22 >> 6) +
                       (ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) +
                       0xffffffffffffffff;
              *puVar1 = *puVar1 & (-2L << (bVar19 & 0x3f) |
                                  0xfffffffffffffffeU >> 0x40 - (bVar19 & 0x3f));
              if (local_1ec != 0) {
                (local_1d0->col_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17] = -INFINITY;
              }
              uVar11 = 0x7ff00000;
              if (local_1e8 != 0) goto LAB_001fa4a6;
            }
            else {
              if ((local_1e8 & local_1ec) == 0) {
                trim(&local_188,&default_non_chars_abi_cxx11_);
                highsLogUser(log_options,kError,"BV row %s but [is_lb, is_ub] = [%1d, %1d]\n",
                             local_188._M_dataplus._M_p,(ulong)local_1ec,(ulong)local_1e8);
                goto LAB_001fa670;
              }
              uVar17 = (ulong)iVar10;
              (local_1d0->col_integrality).
              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17] = kInteger;
              uVar22 = uVar17 + 0x3f;
              if (-1 < (long)uVar17) {
                uVar22 = uVar17;
              }
              puVar1 = (local_1d0->col_binary).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       ((long)uVar22 >> 6) +
                       (ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) +
                       0xffffffffffffffff;
              *puVar1 = *puVar1 | 1L << (bVar19 & 0x3f);
              uVar11 = 0x3ff00000;
LAB_001fa4a6:
              (local_1d0->col_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar10] = (double)((ulong)uVar11 << 0x20);
            }
            if (local_1ec != 0) {
              uVar17 = (ulong)iVar10;
              uVar22 = uVar17 + 0x3f;
              if (-1 < (long)uVar17) {
                uVar22 = uVar17;
              }
              puVar1 = (ulong *)((long)(((long)uVar22 >> 6) * 8 + local_108._M_allocated_capacity) +
                                ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1) *
                                8);
              *puVar1 = *puVar1 | 1L << (bVar19 & 0x3f);
            }
            bVar8 = false;
            if (local_1e8 != 0) {
              uVar17 = (ulong)iVar10;
              uVar22 = uVar17 + 0x3f;
              if (-1 < (long)uVar17) {
                uVar22 = uVar17;
              }
              puVar1 = (ulong *)(local_168._M_allocated_capacity +
                                (((long)uVar22 >> 6) +
                                ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)) *
                                8);
              *puVar1 = *puVar1 | 1L << (bVar19 & 0x3f);
            }
          }
          else {
            id = 0x3d2f67;
            std::__cxx11::string::_M_replace((ulong)local_140,0,local_138,0x3d2f67);
            first_word(&local_d8,&local_70,start_00);
            std::__cxx11::string::operator=((string *)local_140,(string *)&local_d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_d8._M_dataplus._M_p._1_7_,(char)local_d8._M_dataplus._M_p) !=
                &local_d8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_d8._M_dataplus._M_p._1_7_,
                                       (char)local_d8._M_dataplus._M_p));
            }
            local_110 = (pointer)first_word_end(&local_70,start_00);
            pHVar21 = (HMpsFF *)local_140;
            iVar12 = std::__cxx11::string::compare((char *)local_140);
            if (iVar12 == 0) {
              trim(&local_188,&default_non_chars_abi_cxx11_);
              highsLogUser(log_options,kError,"No bound given for %s row \"%s\"\n",local_b8[0],
                           local_188._M_dataplus._M_p);
            }
            else {
              local_d8._M_dataplus._M_p._0_1_ = '\0';
              dVar2 = getValue(pHVar21,(string *)local_140,(bool *)&local_d8,id);
              uVar23 = SUB84(dVar2,0);
              uVar24 = (undefined4)((ulong)dVar2 >> 0x20);
              if ((char)local_d8._M_dataplus._M_p != '\x01') {
                uVar22 = (ulong)iVar10;
                if (local_1a8[0] == '\0') {
                  HVar20 = kSemiContinuous;
                  if (local_1e4 != '\0') goto LAB_001fa6b5;
                }
                else {
                  if (((dVar2 != (double)(int)dVar2) || (NAN(dVar2) || NAN((double)(int)dVar2))) &&
                     (local_198 = local_198 + 1, local_198 % local_120 == 0)) {
                    local_1a8._8_4_ = extraout_XMM0_Dc;
                    local_1a8._0_8_ = dVar2;
                    local_1a8._12_4_ = extraout_XMM0_Dd;
                    highsLogUser(log_options,kWarning,
                                 "Bound for LI/UI/SI column \"%s\" is %g: not integer\n",
                                 local_188._M_dataplus._M_p);
                    local_120 = local_120 * 2;
                    uVar23 = local_1a8._0_4_;
                    uVar24 = local_1a8._4_4_;
                  }
                  HVar20 = local_1e4 * '\x02' + kInteger;
LAB_001fa6b5:
                  (local_1d0->col_integrality).
                  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar22] = HVar20;
                }
                if (local_1ec != 0) {
                  (local_1d0->col_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar22] = (double)CONCAT44(uVar24,uVar23);
                  uVar17 = uVar22 + 0x3f;
                  if (-1 < (long)uVar22) {
                    uVar17 = uVar22;
                  }
                  puVar1 = (ulong *)((long)(((long)uVar17 >> 6) * 8 +
                                           local_108._M_allocated_capacity) +
                                    ((ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) - 1
                                    ) * 8);
                  *puVar1 = *puVar1 | 1L << (bVar19 & 0x3f);
                }
                if (local_1e8 != 0) {
                  (local_1d0->col_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar22] = (double)CONCAT44(uVar24,uVar23);
                  uVar17 = uVar22 + 0x3f;
                  if (-1 < (long)uVar22) {
                    uVar17 = uVar22;
                  }
                  puVar1 = (ulong *)(local_168._M_allocated_capacity +
                                    (((long)uVar17 >> 6) +
                                    ((ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) - 1
                                    )) * 8);
                  *puVar1 = *puVar1 | 1L << (bVar19 & 0x3f);
                }
                uVar17 = uVar22 + 0x3f;
                if (-1 < (long)uVar22) {
                  uVar17 = uVar22;
                }
                puVar1 = (local_1d0->col_binary).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         ((long)uVar17 >> 6) +
                         (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) +
                         0xffffffffffffffff;
                *puVar1 = *puVar1 & (-2L << (bVar19 & 0x3f) |
                                    0xfffffffffffffffeU >> 0x40 - (bVar19 & 0x3f));
                bVar8 = false;
                goto LAB_001fa7cf;
              }
              highsLogUser(log_options,kError,"Bound for column \"%s\" is NaN\n",
                           local_188._M_dataplus._M_p);
            }
LAB_001fa670:
            local_1d8 = kFail;
            bVar8 = true;
          }
        }
        else {
          uVar16 = (ulong)iVar10;
          uVar17 = uVar16 + 0x3f;
          if (-1 < (long)uVar16) {
            uVar17 = uVar16;
          }
          if ((*(ulong *)((long)(((long)uVar17 >> 6) * 8 + local_108._M_allocated_capacity) +
                         ((ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) - 1) * 8) >>
               (uVar16 & 0x3f) & 1) == 0) goto LAB_001fa1ef;
LAB_001fa23c:
          local_190 = local_190 + 1;
          bVar8 = false;
          if (local_190 % (ulong)local_118._M_p == 0) {
            pcVar7 = "BTRAN upper";
            if (local_1ec != 0) {
              pcVar7 = "BTRAN lower";
            }
            highsLogUser(log_options,kWarning,
                         "Column name \"%s\" in BOUNDS section has duplicate %s bound definition: ignored\n"
                         ,local_188._M_dataplus._M_p,pcVar7 + 6);
            local_118._M_p = local_118._M_p * 2;
          }
        }
LAB_001fa7cf:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)local_140);
        if (iVar10 == 0) {
          local_1ec = 1;
          local_1e8 = 0;
          goto LAB_001fa075;
        }
        iVar10 = std::__cxx11::string::compare((char *)local_140);
        if (iVar10 == 0) {
          local_1ec = 1;
          auVar4._12_4_ = 0;
          auVar4._0_12_ = local_1a8._4_12_;
          local_1a8 = auVar4 << 0x20;
          local_1e8 = 1;
          goto LAB_001fa07d;
        }
        iVar10 = std::__cxx11::string::compare((char *)local_140);
        if (iVar10 == 0) {
          local_1ac = local_1ac + 1;
          local_1ec = 1;
          local_1e8 = 0;
LAB_001fa695:
LAB_001fa69d:
          auVar6._12_4_ = 0;
          auVar6._0_12_ = local_1a8._4_12_;
          local_1a8 = auVar6 << 0x20;
LAB_001fa6a5:
          local_1e4 = '\0';
          bVar8 = true;
          goto LAB_001fa088;
        }
        iVar10 = std::__cxx11::string::compare((char *)local_140);
        if (iVar10 == 0) {
          local_1b0 = local_1b0 + 1;
          local_1e8 = 1;
          local_1ec = 0;
          goto LAB_001fa695;
        }
        uVar14 = std::__cxx11::string::compare((char *)local_140);
        if ((int)uVar14 == 0) {
          local_1b4 = local_1b4 + 1;
          local_1ec = 1;
          local_1e8 = 1;
          local_1a8._0_4_ = (int)CONCAT71((int7)((ulong)uVar14 >> 8),1);
          goto LAB_001fa6a5;
        }
        uVar14 = std::__cxx11::string::compare((char *)local_140);
        if ((int)uVar14 == 0) {
          local_1b8 = local_1b8 + 1;
          uVar18 = (undefined7)((ulong)uVar14 >> 8);
          local_1ec = 1;
          local_1e8 = 0;
LAB_001fa89c:
          local_1a8._0_4_ = (int)CONCAT71(uVar18,1);
          goto LAB_001fa07d;
        }
        uVar14 = std::__cxx11::string::compare((char *)local_140);
        if ((int)uVar14 == 0) {
          local_1bc = local_1bc + 1;
          uVar18 = (undefined7)((ulong)uVar14 >> 8);
          local_1e8 = 1;
          local_1ec = 0;
          goto LAB_001fa89c;
        }
        iVar10 = std::__cxx11::string::compare((char *)local_140);
        if (iVar10 == 0) {
          local_1ec = 1;
          local_1e8 = 1;
          goto LAB_001fa69d;
        }
        uVar14 = std::__cxx11::string::compare((char *)local_140);
        if ((int)uVar14 == 0) {
          local_1c0 = local_1c0 + 1;
          local_1a8._0_4_ = (int)CONCAT71((int7)((ulong)uVar14 >> 8),1);
LAB_001fa8f4:
          local_1e8 = 1;
          local_1ec = 0;
          local_1e4 = '\x01';
          goto LAB_001fa085;
        }
        iVar10 = std::__cxx11::string::compare((char *)local_140);
        if (iVar10 == 0) {
          local_1c4 = local_1c4 + 1;
          auVar5._12_4_ = 0;
          auVar5._0_12_ = local_1a8._4_12_;
          local_1a8 = auVar5 << 0x20;
          goto LAB_001fa8f4;
        }
        trim((string *)local_140,&default_non_chars_abi_cxx11_);
        highsLogUser(log_options,kError,"Entry in BOUNDS section of MPS file is of type \"%s\"\n",
                     local_140);
        local_1d8 = kFail;
        bVar8 = true;
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
    }
    else {
      if (local_1ac != 0) {
        highsLogUser(log_options,kInfo,"Number of MI entries in BOUNDS section is %d\n",
                     (ulong)local_1ac);
      }
      if (local_1b0 != 0) {
        highsLogUser(log_options,kInfo,"Number of PL entries in BOUNDS section is %d\n",
                     (ulong)local_1b0);
      }
      if (local_1b4 != 0) {
        highsLogUser(log_options,kInfo,"Number of BV entries in BOUNDS section is %d\n",
                     (ulong)local_1b4);
      }
      if (local_1b8 != 0) {
        highsLogUser(log_options,kInfo,"Number of LI entries in BOUNDS section is %d\n",
                     (ulong)local_1b8);
      }
      if (local_1bc != 0) {
        highsLogUser(log_options,kInfo,"Number of UI entries in BOUNDS section is %d\n",
                     (ulong)local_1bc);
      }
      if (local_1c0 != 0) {
        highsLogUser(log_options,kInfo,"Number of SI entries in BOUNDS section is %d\n",
                     (ulong)local_1c0);
      }
      if (local_1c4 != 0) {
        highsLogUser(log_options,kInfo,"Number of SC entries in BOUNDS section is %d\n",
                     (ulong)local_1c4);
      }
      local_1d0->warning_issued_ = local_190 != 0 || local_198 != 0;
      if (local_190 != 0 || local_198 != 0) {
        highsLogUser(log_options,kWarning,
                     "BOUNDS section: ignored %d duplicate values and %d fractional integer bounds\n"
                     ,local_190,local_198);
      }
      bVar8 = true;
      highsLogDev(log_options,kInfo,"readMPS: Read BOUNDS  OK\n");
      local_1d8 = PVar9;
    }
    this_00 = local_140;
    if (local_140 != (undefined1  [8])&local_130) {
      operator_delete((void *)local_140);
    }
    if (bVar8) {
LAB_001fa907:
      if ((void *)local_168._M_allocated_capacity != (void *)0x0) {
        operator_delete((void *)local_168._M_allocated_capacity);
        local_168._M_allocated_capacity = 0;
        local_168._8_4_ = 0;
        local_158 = 0;
        local_150 = 0;
        local_148 = 0;
      }
      if ((void *)local_108._M_allocated_capacity != (void *)0x0) {
        operator_delete((void *)local_108._M_allocated_capacity);
        local_108._M_allocated_capacity = 0;
        local_108._8_4_ = 0;
        local_f8._0_4_ = ~kMaximize;
        local_f8._4_4_ = 0;
        local_f0 = 0;
        local_e8 = (pointer)0x0;
      }
      if (local_50 != (pointer)local_40) {
        operator_delete(local_50);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      return local_1d8;
    }
  }
  local_1d8 = kTimeout;
  goto LAB_001fa907;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseBounds(const HighsLogOptions& log_options,
                                     std::istream& file) {
  std::string strline, word;

  HighsInt num_mi = 0;
  HighsInt num_pl = 0;
  HighsInt num_bv = 0;
  HighsInt num_li = 0;
  HighsInt num_ui = 0;
  HighsInt num_si = 0;
  HighsInt num_sc = 0;

  std::vector<bool> has_lower;
  std::vector<bool> has_upper;
  has_lower.assign(num_col, false);
  has_upper.assign(num_col, false);

  bool skip;
  size_t num_ignored_duplicate_bound = 0;
  size_t report_ignored_duplicate_bound_frequency = 1;
  size_t num_fractional_integer_bound = 0;
  size_t report_fractional_integer_bound_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    // start of new section?
    if (key != Parsekey::kNone) {
      if (num_mi)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of MI entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_mi);
      if (num_pl)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of PL entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_pl);
      if (num_bv)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of BV entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_bv);
      if (num_li)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of LI entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_li);
      if (num_ui)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of UI entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_ui);
      if (num_si)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of SI entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_si);
      if (num_sc)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of SC entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_sc);
      warning_issued_ =
          num_ignored_duplicate_bound || num_fractional_integer_bound > 0;
      if (warning_issued_)
        highsLogUser(log_options, HighsLogType::kWarning,
                     "BOUNDS section: ignored %d duplicate values and %d "
                     "fractional integer bounds\n",
                     int(num_ignored_duplicate_bound),
                     int(num_fractional_integer_bound));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read BOUNDS  OK\n");
      return key;
    }
    bool is_lb = false;
    bool is_ub = false;
    bool is_integral = false;
    bool is_semi = false;
    bool is_defaultbound = false;
    const std::string bound_type = word;
    if (word == "UP")  // lower bound
      is_ub = true;
    else if (word == "LO")  // upper bound
      is_lb = true;
    else if (word == "FX")  // fixed
    {
      is_lb = true;
      is_ub = true;
    } else if (word == "MI")  // infinite lower bound
    {
      is_lb = true;
      is_defaultbound = true;
      num_mi++;
    } else if (word == "PL")  // infinite upper bound (redundant)
    {
      is_ub = true;
      is_defaultbound = true;
      num_pl++;
    } else if (word == "BV")  // binary
    {
      is_lb = true;
      is_ub = true;
      is_integral = true;
      is_defaultbound = true;
      num_bv++;
    } else if (word == "LI")  // integer lower bound
    {
      is_lb = true;
      is_integral = true;
      num_li++;
    } else if (word == "UI")  // integer upper bound
    {
      is_ub = true;
      is_integral = true;
      num_ui++;
    } else if (word == "FR")  // free variable
    {
      is_lb = true;
      is_ub = true;
      is_defaultbound = true;
    } else if (word == "SI")  // semi-integer variable
    {
      is_ub = true;
      is_integral = true;
      is_semi = true;
      num_si++;
    } else if (word == "SC")  // semi-continuous variable
    {
      is_ub = true;
      is_semi = true;
      num_sc++;
    } else {
      trim(word);
      highsLogUser(log_options, HighsLogType::kError,
                   "Entry in BOUNDS section of MPS file is of type \"%s\"\n",
                   word.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    std::string bound_name = first_word(strline, end);
    size_t end_bound_name = first_word_end(strline, end);

    std::string marker;
    size_t end_marker;
    if (colname2idx.find(bound_name) != colname2idx.end()) {
      // SIF format might not have the bound name, so skip
      // it here if we found the marker instead
      marker = bound_name;
      end_marker = end_bound_name;
    } else {
      // The first word is the bound name, which should be ignored.
      marker = first_word(strline, end_bound_name);
      end_marker = first_word_end(strline, end_bound_name);
    }

    // BOUNDS: get column index from name, without adding new column
    // if not existing yet
    HighsInt colidx = getColIdx(marker, false);
    if (colidx < 0) {
      // add new column if did not exist yet
      colidx = getColIdx(marker, true);
      assert(colidx == num_col - 1);
      has_lower.push_back(false);
      has_upper.push_back(false);
    }

    // Determine whether this entry yields a duplicate bound
    // definition
    if ((is_lb && has_lower[colidx]) || (is_ub && has_upper[colidx])) {
      num_ignored_duplicate_bound++;
      if (num_ignored_duplicate_bound %
              report_ignored_duplicate_bound_frequency ==
          0) {
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "Column name \"%s\" in BOUNDS section has duplicate %s bound "
            "definition: ignored\n",
            marker.c_str(), is_lb ? "lower" : "upper");
        report_ignored_duplicate_bound_frequency *= 2;
      }
      continue;
    }

    if (is_defaultbound) {
      // MI, PL, BV or FR
      if (is_integral)
      // binary: BV
      {
        if (!is_lb || !is_ub) {
          trim(marker);
          highsLogUser(log_options, HighsLogType::kError,
                       "BV row %s but [is_lb, is_ub] = [%1" HIGHSINT_FORMAT
                       ", %1" HIGHSINT_FORMAT "]\n",
                       marker.c_str(), is_lb, is_ub);
          assert(is_lb && is_ub);
          return HMpsFF::Parsekey::kFail;
        }
        assert(is_lb && is_ub);
        // Mark the column as integer and binary
        col_integrality[colidx] = HighsVarType::kInteger;
        col_binary[colidx] = true;
        assert(col_lower[colidx] == 0.0);
        col_upper[colidx] = 1.0;
      } else {
        // continuous: MI, PL or FR
        col_binary[colidx] = false;
        if (is_lb) col_lower[colidx] = -kHighsInf;
        if (is_ub) col_upper[colidx] = kHighsInf;
      }
      if (is_lb) has_lower[colidx] = true;
      if (is_ub) has_upper[colidx] = true;
      continue;
    }
    // Bounds now are UP, LO, FX, LI, UI, SI or SC
    // here marker is the col name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No bound given for %s row \"%s\"\n", bound_type.c_str(),
                   marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }
    bool is_nan = false;
    double value = getValue(word, is_nan);  // atof(word.c_str());
    if (is_nan) {
      highsLogUser(log_options, HighsLogType::kError,
                   "Bound for column \"%s\" is NaN\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }
    if (is_integral) {
      assert(is_lb || is_ub || is_semi);
      // Must be LI, UI or SI, and value should be integer
      HighsInt i_value = static_cast<HighsInt>(value);
      double dl = value - i_value;
      if (dl) {
        num_fractional_integer_bound++;
        if (num_fractional_integer_bound %
                report_fractional_integer_bound_frequency ==
            0) {
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Bound for LI/UI/SI column \"%s\" is %g: not integer\n",
                       marker.c_str(), value);
          report_fractional_integer_bound_frequency *= 2;
        }
      }
      if (is_semi) {
        // Bound marker SI defines the column as semi-integer
        col_integrality[colidx] = HighsVarType::kSemiInteger;
      } else {
        // Bound marker LI or UI defines the column as integer
        col_integrality[colidx] = HighsVarType::kInteger;
      }
    } else if (is_semi) {
      // Bound marker SC defines the column as semi-continuous
      col_integrality[colidx] = HighsVarType::kSemiContinuous;
    }
    // Assign the bounds that have been read
    if (is_lb) {
      col_lower[colidx] = value;
      has_lower[colidx] = true;
    }
    if (is_ub) {
      col_upper[colidx] = value;
      has_upper[colidx] = true;
    }
    // Column is not binary by default
    col_binary[colidx] = false;
  }
  return Parsekey::kFail;
}